

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

bool __thiscall IPStatsRecord::WriteRecord(IPStatsRecord *this,FILE *F)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int i;
  long lVar8;
  
  bVar1 = WriteIP(this,F);
  iVar2 = fprintf((FILE *)F,",%lu",this->query_volume);
  bVar1 = 0 < iVar2 && bVar1;
  lVar8 = 4;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",*(undefined8 *)(this->ip_addr + lVar8 * 8 + -8));
    bVar1 = (bool)(bVar1 & 0 < iVar2);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1c);
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->daily_volume[lVar8]);
    bVar1 = (bool)(bVar1 & 0 < iVar2);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1f);
  iVar2 = fprintf((FILE *)F,",%lu",this->arpa_count);
  iVar3 = fprintf((FILE *)F,",%lu",this->no_such_domain_queries);
  iVar4 = fprintf((FILE *)F,",%lu",this->no_such_domain_reserved);
  iVar5 = fprintf((FILE *)F,",%lu",this->no_such_domain_frequent);
  iVar6 = fprintf((FILE *)F,",%lu",this->no_such_domain_chromioids);
  bVar7 = bVar1 & (0 < iVar6 && ((0 < iVar5 && 0 < iVar4) && (0 < iVar3 && 0 < iVar2)));
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->tld_counts[lVar8]);
    bVar7 = bVar7 & 0 < iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  iVar2 = fprintf((FILE *)F,",");
  bVar1 = HyperLogLog::WriteHyperLogLog(&this->tld_hyperlog,F);
  bVar7 = bVar7 & (bVar1 && 0 < iVar2);
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->sld_counts[lVar8]);
    bVar7 = bVar7 & 0 < iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  iVar2 = fprintf((FILE *)F,",");
  bVar1 = HyperLogLog::WriteHyperLogLog(&this->sld_hyperlog,F);
  bVar7 = bVar7 & (bVar1 && 0 < iVar2);
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->name_parts[lVar8]);
    bVar7 = bVar7 & 0 < iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->rr_types[lVar8]);
    bVar7 = bVar7 & 0 < iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  lVar8 = 0;
  do {
    iVar2 = fprintf((FILE *)F,",%lu",this->locales[lVar8]);
    bVar7 = bVar7 & 0 < iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  iVar2 = fprintf((FILE *)F,"\n");
  return (bool)(bVar7 & 0 < iVar2);
}

Assistant:

bool IPStatsRecord::WriteRecord(FILE* F)
{
    bool ret = WriteIP(F);
    ret &= (fprintf(F, ",%" PRIu64, query_volume) > 0);
    for (int i = 0; i < 24; i++) {
        ret &= (fprintf(F, ",%" PRIu64, hourly_volume[i]) > 0);
    }
    for (int i = 0; i < 31; i++) {
        ret &= (fprintf(F, ",%" PRIu64, daily_volume[i]) > 0);
    }
    ret &= (fprintf(F, ",%" PRIu64, arpa_count) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_queries) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_reserved) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_frequent) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_chromioids) > 0);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, tld_counts[i]) > 0);
    }
    ret &= (fprintf(F, ",") > 0);
    ret &= tld_hyperlog.WriteHyperLogLog(F);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, sld_counts[i]) > 0);
    }
    ret &= (fprintf(F, ",") > 0);
    ret &= sld_hyperlog.WriteHyperLogLog(F);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, name_parts[i]) > 0);
    }
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, rr_types[i]) > 0);
    }
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, locales[i]) > 0);
    }
    ret &= (fprintf(F, "\n") > 0);

    return ret;
}